

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::MainBuilder::Impl::Arg>::setCapacity
          (Vector<kj::MainBuilder::Impl::Arg> *this,size_t newSize)

{
  long lVar1;
  ArrayBuilder<kj::MainBuilder::Impl::Arg> newBuilder;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x28)) {
    ArrayBuilder<kj::MainBuilder::Impl::Arg>::truncate(&this->builder,(char *)newSize,lVar1 % 0x28);
  }
  newBuilder.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::MainBuilder::Impl::Arg>(newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<kj::MainBuilder::Impl::Arg>::addAll<kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>>
            (&newBuilder,&this->builder);
  ArrayBuilder<kj::MainBuilder::Impl::Arg>::operator=(&this->builder,&newBuilder);
  ArrayBuilder<kj::MainBuilder::Impl::Arg>::dispose(&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }